

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic.cpp
# Opt level: O2

void canonic_sampling(uint blocks)

{
  allocator<char> local_2899;
  string local_2898;
  string local_2878;
  Histogram<unsigned_int> histogram;
  FixedDegreeNetwork network;
  CanonicSampler sampler;
  Random rng;
  
  FixedDegreeNetwork::FixedDegreeNetwork((FixedDegreeNetwork *)&network.super_Network,3,blocks);
  Histogram<unsigned_int>::Histogram
            (&histogram,0,network.super_Network.total_triangles / 3,
             network.super_Network.total_triangles / 3 + 1);
  Random::Random(&rng,2);
  sampler.super_UniformSampler._vptr_UniformSampler = (_func_int **)&PTR_markov_step_00110d68;
  sampler.beta = 1.0;
  sampler.super_UniformSampler.super_Sampler.rng = &rng;
  sampler.super_UniformSampler.super_Sampler.histogram = &histogram;
  sampler.super_UniformSampler.proposer.rng = &rng;
  sampler.super_UniformSampler.network = &network.super_Network;
  CanonicSampler::sample(&sampler,1000000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2898,"canonic_%d.dat",&local_2899);
  format(&local_2878,&local_2898,blocks);
  Histogram<unsigned_int>::export_histogram(&histogram,&local_2878);
  std::__cxx11::string::~string((string *)&local_2878);
  std::__cxx11::string::~string((string *)&local_2898);
  std::random_device::~random_device(&rng.rd);
  Histogram<unsigned_int>::~Histogram(&histogram);
  Network::~Network(&network.super_Network);
  return;
}

Assistant:

void canonic_sampling(unsigned int blocks) {
    FixedDegreeNetwork network(3, blocks);

    Histogram<unsigned int> histogram(0, network.get_triangles(),
                                      network.get_triangles() + 1);
    Random rng(2);

    double beta = 1;
    CanonicSampler sampler(rng, histogram, network, beta);
    sampler.sample(1000000);
    histogram.export_histogram(format("canonic_%d.dat", blocks));
}